

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.cpp
# Opt level: O0

int __thiscall dic::rehash(dic *this,int dictidx)

{
  unsigned_long uVar1;
  dictEntry *pdVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  reference pvVar5;
  ulong uVar6;
  dictEntry **ppdVar7;
  reference pvVar8;
  __type _Var9;
  dictht *newht;
  uint i_2;
  uint i_1;
  dictEntry *fetch;
  unsigned_long tmpsize;
  unsigned_long newsize;
  dictEntry *tmp;
  int local_18;
  int index;
  int i;
  int dictidx_local;
  dic *this_local;
  
  local_18 = 1;
  pvVar5 = std::vector<dict,_std::allocator<dict>_>::operator[](&this->dc,(long)dictidx);
  pvVar5->type->hashFunction = murmurhash2;
  pvVar5 = std::vector<dict,_std::allocator<dict>_>::operator[](&this->dc,(long)dictidx);
  uVar1 = pvVar5->ht[0].size;
  _Var9 = std::pow<int,int>(2,1);
  fetch = (dictEntry *)((long)_Var9 | (long)(_Var9 - 9.223372036854776e+18) & (long)_Var9 >> 0x3f);
  while (fetch < (dictEntry *)(uVar1 * 2)) {
    local_18 = local_18 + 1;
    _Var9 = std::pow<int,int>(2,local_18);
    fetch = (dictEntry *)((long)_Var9 | (long)(_Var9 - 9.223372036854776e+18) & (long)_Var9 >> 0x3f)
    ;
  }
  pvVar5 = std::vector<dict,_std::allocator<dict>_>::operator[](&this->dc,(long)dictidx);
  pvVar5->ht[1].size = (unsigned_long)fetch;
  pvVar5 = std::vector<dict,_std::allocator<dict>_>::operator[](&this->dc,(long)dictidx);
  pvVar5->ht[1].sizemask = (unsigned_long)((long)&fetch[-1].next + 7);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = fetch;
  uVar6 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  ppdVar7 = (dictEntry **)operator_new__(uVar6);
  pvVar5 = std::vector<dict,_std::allocator<dict>_>::operator[](&this->dc,(long)dictidx);
  pvVar5->ht[1].table = ppdVar7;
  for (newht._4_4_ = 0;
      pvVar5 = std::vector<dict,_std::allocator<dict>_>::operator[](&this->dc,(long)dictidx),
      (ulong)newht._4_4_ < pvVar5->ht[0].size; newht._4_4_ = newht._4_4_ + 1) {
    pvVar5 = std::vector<dict,_std::allocator<dict>_>::operator[](&this->dc,(long)dictidx);
    for (_i_2 = pvVar5->ht[0].table[newht._4_4_]; _i_2 != (dictEntry *)0x0; _i_2 = _i_2->next) {
      pvVar5 = std::vector<dict,_std::allocator<dict>_>::operator[](&this->dc,(long)dictidx);
      uVar4 = (*pvVar5->type->hashFunction)(_i_2->key);
      pvVar5 = std::vector<dict,_std::allocator<dict>_>::operator[](&this->dc,(long)dictidx);
      uVar4 = uVar4 & (uint)pvVar5->ht[1].sizemask;
      pvVar5 = std::vector<dict,_std::allocator<dict>_>::operator[](&this->dc,(long)dictidx);
      newsize = (unsigned_long)pvVar5->ht[1].table[(int)uVar4];
      if ((dictEntry *)newsize == (dictEntry *)0x0) {
        pvVar5 = std::vector<dict,_std::allocator<dict>_>::operator[](&this->dc,(long)dictidx);
        pvVar5->ht[1].table[(int)uVar4] = _i_2;
      }
      else {
        for (; *(long *)(newsize + 0x10) != 0; newsize = *(unsigned_long *)(newsize + 0x10)) {
        }
        *(dictEntry **)(newsize + 0x10) = _i_2;
      }
    }
  }
  for (newht._0_4_ = 0;
      pvVar5 = std::vector<dict,_std::allocator<dict>_>::operator[](&this->dc,(long)dictidx),
      (ulong)(uint)newht < pvVar5->ht[0].size; newht._0_4_ = (uint)newht + 1) {
    pvVar5 = std::vector<dict,_std::allocator<dict>_>::operator[](&this->dc,(long)dictidx);
    pdVar2 = pvVar5->ht[0].table[(uint)newht];
    while (_i_2 = pdVar2, _i_2 != (dictEntry *)0x0) {
      pdVar2 = _i_2->next;
      if (_i_2 != (dictEntry *)0x0) {
        operator_delete(_i_2);
      }
    }
  }
  pvVar5 = std::vector<dict,_std::allocator<dict>_>::operator[](&this->dc,(long)dictidx);
  pvVar8 = std::vector<dict,_std::allocator<dict>_>::operator[](&this->dc,(long)dictidx);
  dictht::operator=(pvVar8->ht,pvVar5->ht + 1);
  uRam0000000000000000 = 0;
  uRam0000000000000008 = 0;
  uRam0000000000000010 = 0;
  uRam0000000000000018 = 0;
  pvVar5 = std::vector<dict,_std::allocator<dict>_>::operator[](&this->dc,(long)dictidx);
  dictht::operator=(pvVar5->ht + 1,(dictht *)0x0);
  return 1;
}

Assistant:

int dic::rehash(int dictidx){
    int i=1,index;
    dictEntry *tmp=NULL;
    dc[dictidx].type->hashFunction=dic::murmurhash2;
    unsigned long newsize=dc[dictidx].ht[0].size*2;
    unsigned long tmpsize=pow(2,i);
    while(newsize>tmpsize){
        tmpsize=pow(2,++i);
    }
    newsize=tmpsize;

    dc[dictidx].ht[1].size=newsize;
    dc[dictidx].ht[1].sizemask=newsize-1;
    dc[dictidx].ht[1].table=new dictEntry*[newsize];

    dictEntry *fetch=NULL;
    for(unsigned int i=0;i<dc[dictidx].ht[0].size;i++){
        fetch=dc[dictidx].ht[0].table[i];
        while(fetch!=NULL){
            index=dc[dictidx].type->hashFunction(fetch->key)&dc[dictidx].ht[1].sizemask;
            tmp=dc[dictidx].ht[1].table[index];
            if(tmp==NULL)
                dc[dictidx].ht[1].table[index]=fetch;
            else
            {
                while(tmp->next!=NULL){
                    tmp=tmp->next;
                }
                tmp->next=fetch;
            }
            fetch=fetch->next;
        }
    }
    //ht[0] -> ht[1] done

    //relese ht[0]
    fetch=tmp=NULL;    
    for(unsigned int i=0;i<dc[dictidx].ht[0].size;i++){
        fetch=dc[dictidx].ht[0].table[i];
        while(fetch!=NULL){
            tmp=fetch;
            fetch=fetch->next;
            delete tmp;
            tmp=NULL;
        }
    }  

    //override =
    dc[dictidx].ht[0]=dc[dictidx].ht[1];


    dictht *newht=NULL;
    newht->table=NULL;
    newht->size=0;
    newht->sizemask=0;
    newht->used=0;
    dc[dictidx].ht[1]=*newht;

    return 1;
}